

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
* __thiscall
Graph::random_two_bridges_search
          (vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
           *__return_storage_ptr__,Graph *this,bool recursive)

{
  pointer pEVar1;
  pointer pEVar2;
  pointer pEVar3;
  undefined7 in_register_00000011;
  pointer pEVar4;
  pointer pEVar5;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> copy;
  Bridges bridges;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> local_60;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clear(this);
  if ((int)CONCAT71(in_register_00000011,recursive) == 0) {
    dfsForRandomIterative(this);
  }
  else {
    dfsForRandomRecursive(this,0);
  }
  std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector(&local_60,&this->edges);
  srs::radixSort(&local_60);
  pEVar5 = local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pEVar3 = local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pEVar5 == local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                  super__Vector_impl_data._M_finish) break;
    local_48 = (void *)0x0;
    uStack_40 = 0;
    local_38 = 0;
    pEVar5 = pEVar5 + -1;
    do {
      pEVar4 = local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pEVar5 + 2 ==
          local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      pEVar1 = pEVar5 + 1;
      pEVar4 = pEVar5 + 1;
      pEVar2 = pEVar5 + 2;
      pEVar5 = pEVar4;
    } while (pEVar1->shift != pEVar2->shift);
    if (pEVar4 == local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                  super__Vector_impl_data._M_finish) break;
    pEVar5 = pEVar4;
    if (pEVar4 != local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      do {
        if (pEVar5->shift != pEVar4->shift) break;
        std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>::
        emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<Graph::LightEdge,std::allocator<Graph::LightEdge>> *)&local_48,
                   (unsigned_long *)pEVar5,&(pEVar5->super_LightEdge).v);
        pEVar5 = pEVar5 + 1;
      } while (pEVar5 != local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_48);
    if (local_48 != (void *)0x0) {
      operator_delete(local_48,local_38 - (long)local_48);
    }
  } while (pEVar4 != pEVar3);
  if (local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Graph::Bridges> Graph::random_two_bridges_search(bool recursive) {
    std::vector<Graph::Bridges> out;
    clear();

    if (recursive)
        dfsForRandomRecursive(0);
    else
        dfsForRandomIterative();

    auto copy = edges;
    srs::radixSort(copy);

    for (auto it = copy.begin(), jt = it; it != copy.end(); jt = it) {
        Graph::Bridges bridges;

        jt = it = std::adjacent_find(jt, copy.end());

        if (jt == copy.end())
            break;

        while (it != copy.end() && *it == *jt) {
            bridges.emplace_back(it->u, it->v);
            ++it;
        }

        out.push_back(bridges);
    }

    return out;
}